

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::TextFilesDiffer(string *path1,string *path2)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  undefined1 local_480 [6];
  bool hasData2;
  bool hasData1;
  string line2;
  string line1;
  long local_430;
  ifstream if2;
  long local_228;
  ifstream if1;
  string *path2_local;
  string *path1_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_228,pcVar4,_S_in);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_430,pcVar4,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (((bVar1 & 1) == 0) &&
     (bVar1 = std::ios::operator!((ios *)((long)&local_430 + *(long *)(local_430 + -0x18))),
     (bVar1 & 1) == 0)) {
    do {
      std::__cxx11::string::string((string *)(line2.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_480);
      bVar2 = GetLineFromStream((istream *)&local_228,(string *)(line2.field_2._M_local_buf + 8),
                                (bool *)0x0,0xffffffffffffffff);
      bVar3 = GetLineFromStream((istream *)&local_430,(string *)local_480,(bool *)0x0,
                                0xffffffffffffffff);
      if (bVar2 == bVar3) {
        if (bVar2) {
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&line2.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_480);
          if (bVar2) {
            path1_local._7_1_ = 1;
            line1.field_2._8_4_ = 1;
          }
          else {
            line1.field_2._8_4_ = 0;
          }
        }
        else {
          line1.field_2._8_4_ = 2;
        }
      }
      else {
        path1_local._7_1_ = 1;
        line1.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_480);
      std::__cxx11::string::~string((string *)(line2.field_2._M_local_buf + 8));
    } while (line1.field_2._8_4_ == 0);
    if (line1.field_2._8_4_ == 2) {
      path1_local._7_1_ = 0;
    }
  }
  else {
    path1_local._7_1_ = 1;
  }
  std::ifstream::~ifstream(&local_430);
  std::ifstream::~ifstream(&local_228);
  return (bool)(path1_local._7_1_ & 1);
}

Assistant:

bool SystemTools::TextFilesDiffer(const std::string& path1,
                                  const std::string& path2)
{
  kwsys::ifstream if1(path1.c_str());
  kwsys::ifstream if2(path2.c_str());
  if (!if1 || !if2) {
    return true;
  }

  for (;;) {
    std::string line1, line2;
    bool hasData1 = GetLineFromStream(if1, line1);
    bool hasData2 = GetLineFromStream(if2, line2);
    if (hasData1 != hasData2) {
      return true;
    }
    if (!hasData1) {
      break;
    }
    if (line1 != line2) {
      return true;
    }
  }
  return false;
}